

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

stbi_uc * stbi__readval(stbi__context *s,int channel,stbi_uc *dest)

{
  stbi_uc sVar1;
  int iVar2;
  int local_30;
  uint local_2c;
  int i;
  int mask;
  stbi_uc *dest_local;
  int channel_local;
  stbi__context *s_local;
  
  local_2c = 0x80;
  local_30 = 0;
  do {
    if (3 < local_30) {
      return dest;
    }
    if ((channel & local_2c) != 0) {
      iVar2 = stbi__at_eof(s);
      if (iVar2 != 0) {
        stbi__err("bad file");
        return (stbi_uc *)0x0;
      }
      sVar1 = stbi__get8(s);
      dest[local_30] = sVar1;
    }
    local_30 = local_30 + 1;
    local_2c = (int)local_2c >> 1;
  } while( true );
}

Assistant:

static stbi_uc *stbi__readval(stbi__context *s, int channel, stbi_uc *dest) {
  int mask = 0x80, i;

  for (i = 0; i < 4; ++i, mask >>= 1) {
    if (channel & mask) {
      if (stbi__at_eof(s))
        return stbi__errpuc("bad file", "PIC file too short");
      dest[i] = stbi__get8(s);
    }
  }

  return dest;
}